

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O2

int dohistory(void)

{
  nh_menuitem *pnVar1;
  boolean bVar2;
  char cVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  menulist menu;
  char buf [256];
  
  bVar2 = flags.debug;
  cVar3 = (char)program_state.gameover;
  if (histcount < 2) {
    if (cVar3 == '\0') {
      pline("History has not recorded anything about you.");
    }
  }
  else {
    uVar8 = program_state.gameover & 0xff;
    init_menulist(&menu);
    lVar7 = 8;
    uVar4 = histcount;
    for (uVar9 = 0; uVar9 < uVar4; uVar9 = uVar9 + 1) {
      if (((*(int *)(histevents->what + lVar7 + -0xc) == 0) || (uVar8 != 0)) || (bVar2 != '\0')) {
        pcVar5 = "# ";
        if (flags.debug == '\0') {
          pcVar5 = "";
        }
        if (cVar3 != '\0') {
          pcVar5 = "";
        }
        if (*(int *)(histevents->what + lVar7 + -0xc) == 0) {
          pcVar5 = "";
        }
        snprintf(buf,0x100,"%sOn T:%u you %s",pcVar5,
                 (ulong)*(uint *)(histevents->what + lVar7 + -0x10),histevents->what + lVar7 + -8);
        lVar6 = (long)menu.size;
        if (menu.size <= menu.icount) {
          menu.size = menu.size * 2;
          menu.items = (nh_menuitem *)realloc(menu.items,lVar6 * 0x218);
        }
        pnVar1 = menu.items + menu.icount;
        pnVar1->id = 0;
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,buf);
        menu.icount = menu.icount + 1;
        uVar4 = histcount;
      }
      lVar7 = lVar7 + 0x108;
    }
    display_menu(menu.items,menu.icount,"History has recorded:",0,(int *)0x0);
    free(menu.items);
  }
  return 0;
}

Assistant:

int dohistory(void)
{
    struct menulist menu;
    boolean over = program_state.gameover;
    boolean showall = over || wizard;
    char buf[BUFSZ];
    int i;
    
    if (histcount < 2) {
	/* you get an automatic entry on turn 1 for being born.
	 * If it's the only one, there is nothing worth reporting */
	if (!over)
	    pline("History has not recorded anything about you.");
	return 0;
    }
    
    init_menulist(&menu);
    for (i = 0; i < histcount; i++) {
	if (histevents[i].hidden && !showall)
	    continue;
	snprintf(buf, BUFSZ, "%sOn T:%u you %s",
		 (histevents[i].hidden && !over && wizard) ? "# " : "",
		 histevents[i].when, histevents[i].what);
	add_menutext(&menu, buf);
    }
    
    display_menu(menu.items, menu.icount, "History has recorded:", PICK_NONE, NULL);
    free(menu.items);
    
    return 0;
}